

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

Future<int> * __thiscall
Omega_h::Comm::ialltoallv<int>
          (Future<int> *__return_storage_ptr__,Comm *this,Read<int> *sendbuf_dev,
          Read<int> *sdispls_dev,Read<int> *rdispls_dev,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  ScopedTimer timer;
  ScopedTimer local_21;
  Read<int> local_20;
  
  begin_code("Comm::ialltoallv",(char *)0x0);
  local_20.write_.shared_alloc_.alloc = (sendbuf_dev->write_).shared_alloc_.alloc;
  if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
      local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_20.write_.shared_alloc_.alloc =
           (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_20.write_.shared_alloc_.alloc)->use_count =
           (local_20.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_20.write_.shared_alloc_.direct_ptr = (sendbuf_dev->write_).shared_alloc_.direct_ptr;
  Future<int>::Future(__return_storage_ptr__,&local_20);
  pAVar2 = local_20.write_.shared_alloc_.alloc;
  if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
      local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_20.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_21);
  return __return_storage_ptr__;
}

Assistant:

Future<T> Comm::ialltoallv(Read<T> sendbuf_dev, Read<LO> sdispls_dev,
    Read<LO> rdispls_dev, Int width) const {
  ScopedTimer timer("Comm::ialltoallv");
#ifdef OMEGA_H_USE_MPI
#if defined(OMEGA_H_USE_CUDA) && !defined(OMEGA_H_USE_CUDA_AWARE_MPI)
  auto self_data = self_send_part1(self_dst_, self_src_, &sendbuf_dev,
      &sdispls_dev, &rdispls_dev, width, library_->self_send_threshold());
#endif
  HostRead<LO> sdispls(sdispls_dev);
  HostRead<LO> rdispls(rdispls_dev);
  OMEGA_H_CHECK(sendbuf_dev.size() == sdispls.last() * width);
  int nrecvd = rdispls.last() * width;
#if defined(OMEGA_H_USE_CUDA) && !defined(OMEGA_H_USE_CUDA_AWARE_MPI)
  HostWrite<T> recvbuf(nrecvd);
  HostRead<T> sendbuf(sendbuf_dev);
  OMEGA_H_CHECK(recvbuf.size() == rdispls.last() * width);
  auto reqs = Neighbor_ialltoallv(host_srcs_, host_dsts_, width,
      nonnull(sendbuf.data()), nonnull(sdispls.data()),
      MpiTraits<T>::datatype(), nonnull(recvbuf.data()),
      nonnull(rdispls.data()), MpiTraits<T>::datatype(), impl_);
  auto callback = [=](HostWrite<T> buf) -> Read<T> {
    auto recvbuf_dev = Read<T>(buf.write());
    self_send_part2(self_data, self_src_, &recvbuf_dev, rdispls_dev, width);
    return recvbuf_dev;
  };
  return {sendbuf, recvbuf, std::move(reqs), callback};
#else   // !defined(OMEGA_H_USE_CUDA) || defined(OMEGA_H_USE_CUDA_AWARE_MPI)
  Write<T> recvbuf_dev_w(nrecvd);
  OMEGA_H_CHECK(recvbuf_dev_w.size() == rdispls.last() * width);
  auto reqs = Neighbor_ialltoallv(host_srcs_, host_dsts_, width,
      nonnull(sendbuf_dev.data()), nonnull(sdispls.data()),
      MpiTraits<T>::datatype(), nonnull(recvbuf_dev_w.data()),
      nonnull(rdispls.data()), MpiTraits<T>::datatype(), impl_,
      sendbuf_dev.size(), recvbuf_dev_w.size());
  return {sendbuf_dev, recvbuf_dev_w, std::move(reqs)};
#endif  // !defined(OMEGA_H_USE_CUDA) || defined(OMEGA_H_USE_CUDA_AWARE_MPI)
#else   // !defined(OMEGA_H_USE_MPI)
  (void)sdispls_dev;
  (void)rdispls_dev;
  (void)width;
  return Future<T>(sendbuf_dev);
#endif  // !defined(OMEGA_H_USE_MPI)
}